

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O1

void __thiscall CServerBrowserFilter::CServerFilter::Filter(CServerFilter *this)

{
  char *needle;
  char cVar1;
  uint uVar2;
  uint uVar3;
  CConfig *pCVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  CServerBrowserFilter *pCVar9;
  byte bVar10;
  int iVar11;
  CServerEntry *pCVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  
  uVar2 = this->m_pServerBrowserFilter->m_NumServers;
  this->m_NumSortedPlayers = 0;
  this->m_NumSortedServers = 0;
  if (this->m_SortedServersCapacity < (int)uVar2) {
    if (this->m_pSortedServerlist != (int *)0x0) {
      mem_free(this->m_pSortedServerlist);
    }
    iVar5 = (int)uVar2 / 2 + uVar2;
    iVar11 = 1000;
    if (1000 < iVar5) {
      iVar11 = iVar5;
    }
    this->m_SortedServersCapacity = iVar11;
    piVar7 = (int *)mem_alloc(iVar11 << 2);
    this->m_pSortedServerlist = piVar7;
  }
  if (0 < (int)uVar2) {
    needle = (this->m_FilterInfo).m_aAddress;
    uVar13 = 0;
    do {
      uVar3 = (this->m_FilterInfo).m_SortHash;
      bVar10 = (byte)uVar3;
      iVar11 = *(int *)((long)(&(this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).
                                m_NetAddr + 1) + ((ulong)(bVar10 >> 7) * 2 + 3) * 4);
      if ((uVar3 & 0x10) != 0) {
        pCVar12 = this->m_pServerBrowserFilter->m_ppServerlist[uVar13];
        iVar11 = iVar11 - (pCVar12->m_Info).m_NumBotPlayers;
        if (-1 < (char)bVar10) {
          iVar11 = iVar11 - (pCVar12->m_Info).m_NumBotSpectators;
        }
      }
      if ((((((uVar3 & 0x20) == 0) || (iVar11 != 0)) &&
           (((uVar3 & 0x40) == 0 ||
            (((-1 < (char)bVar10 ||
              (pCVar12 = this->m_pServerBrowserFilter->m_ppServerlist[uVar13],
              (pCVar12->m_Info).m_NumPlayers != (pCVar12->m_Info).m_MaxPlayers)) &&
             (pCVar12 = this->m_pServerBrowserFilter->m_ppServerlist[uVar13],
             (pCVar12->m_Info).m_NumClients != (pCVar12->m_Info).m_MaxClients)))))) &&
          ((((uVar3 >> 9 & 1) == 0 ||
            (((this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).m_Flags & 1) == 0)) &&
           (((uVar3 >> 10 & 1) == 0 ||
            ((this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).m_Favorite == true))))))
         && ((((uVar3 >> 0xc & 1) == 0 ||
              (((this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).m_Flags & 2) != 0))
             && (((uVar3 >> 0xd & 1) == 0 ||
                 (((this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).m_Flags & 4) != 0)
                 ))))) {
        pCVar12 = this->m_pServerBrowserFilter->m_ppServerlist[uVar13];
        if ((((pCVar12->m_Info).m_Latency <= (this->m_FilterInfo).m_Ping) &&
            (((uVar3 >> 0xb & 1) == 0 ||
             (iVar5 = str_comp_num((pCVar12->m_Info).m_aVersion,
                                   this->m_pServerBrowserFilter->m_aNetVersion,3), iVar5 == 0)))) &&
           (((*needle == '\0' ||
             (pcVar8 = str_find_nocase((this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info
                                       ).m_aAddress,needle), pcVar8 != (char *)0x0)) &&
            (((uint)(this->m_FilterInfo).m_ServerLevel >>
              ((this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).m_ServerLevel & 0x1fU)
             & 1) == 0)))) {
          if ((this->m_FilterInfo).m_aGametype[0][0] != '\0') {
            lVar14 = 0x18;
            bVar10 = 0;
            pcVar8 = (this->m_FilterInfo).m_aGametypeExclusive;
            do {
              bVar16 = true;
              bVar17 = true;
              if (*(char *)((long)((this->m_FilterInfo).m_aGametype + -2) + 8 + lVar14) == '\0')
              break;
              cVar1 = *pcVar8;
              iVar5 = str_comp_nocase((this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info)
                                      .m_aGameType,
                                      (char *)((long)((this->m_FilterInfo).m_aGametype + -2) + 8 +
                                              lVar14));
              if (cVar1 == '\0') {
                bVar10 = 1;
              }
              if (iVar5 == 0) {
                bVar16 = cVar1 != '\0';
                bVar17 = cVar1 == '\0';
                break;
              }
              pcVar8 = pcVar8 + 1;
              lVar14 = lVar14 + 0x10;
            } while (lVar14 != 0x98);
            if ((!bVar17) || ((bool)(bVar16 & bVar10))) goto LAB_0012d8ba;
          }
          if (((this->m_FilterInfo).m_SortHash & 0x4000) == 0) {
LAB_0012daa9:
            pCVar4 = this->m_pServerBrowserFilter->m_pConfig;
            if (pCVar4->m_BrFilterString[0] != '\0') {
              pCVar12 = this->m_pServerBrowserFilter->m_ppServerlist[uVar13];
              (pCVar12->m_Info).m_QuickSearchHit = 0;
              pcVar8 = str_find_nocase((pCVar12->m_Info).m_aName,pCVar4->m_BrFilterString);
              bVar17 = pcVar8 != (char *)0x0;
              if (bVar17) {
                piVar7 = &(this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).
                          m_QuickSearchHit;
                *piVar7 = *piVar7 | 1;
              }
              pCVar9 = this->m_pServerBrowserFilter;
              pCVar12 = pCVar9->m_ppServerlist[uVar13];
              if (0 < (pCVar12->m_Info).m_NumClients) {
                lVar15 = 0x1b8;
                lVar14 = 0;
                do {
                  pcVar8 = str_find_nocase((char *)((pCVar12->m_Addr).ip + lVar15 + -4),
                                           pCVar9->m_pConfig->m_BrFilterString);
                  if ((pcVar8 != (char *)0x0) ||
                     (pcVar8 = str_find_nocase((char *)((this->m_pServerBrowserFilter->
                                                         m_ppServerlist[uVar13]->m_Info).m_NetAddr.
                                                        ip + lVar15 + 0xd),
                                               this->m_pServerBrowserFilter->m_pConfig->
                                               m_BrFilterString), pcVar8 != (char *)0x0)) {
                    piVar7 = &(this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).
                              m_QuickSearchHit;
                    *piVar7 = *piVar7 | 2;
                    bVar17 = true;
                    break;
                  }
                  lVar14 = lVar14 + 1;
                  pCVar9 = this->m_pServerBrowserFilter;
                  pCVar12 = pCVar9->m_ppServerlist[uVar13];
                  lVar15 = lVar15 + 0x84;
                } while (lVar14 < (pCVar12->m_Info).m_NumClients);
              }
              pcVar8 = str_find_nocase((this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info
                                       ).m_aMap,this->m_pServerBrowserFilter->m_pConfig->
                                                m_BrFilterString);
              if (pcVar8 != (char *)0x0) {
                piVar7 = &(this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).
                          m_QuickSearchHit;
                *piVar7 = *piVar7 | 4;
                bVar17 = true;
              }
              pcVar8 = str_find_nocase((this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info
                                       ).m_aGameType,
                                       this->m_pServerBrowserFilter->m_pConfig->m_BrFilterString);
              if (pcVar8 != (char *)0x0) {
                piVar7 = &(this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).
                          m_QuickSearchHit;
                *piVar7 = *piVar7 | 8;
                bVar17 = true;
              }
              if (!bVar17) goto LAB_0012d8ba;
            }
            (this->m_pServerBrowserFilter->m_ppServerlist[uVar13]->m_Info).m_FriendState = 0;
            pCVar9 = this->m_pServerBrowserFilter;
            pCVar12 = pCVar9->m_ppServerlist[uVar13];
            if (0 < (pCVar12->m_Info).m_NumClients) {
              lVar14 = 0x1b8;
              lVar15 = 0;
              do {
                iVar6 = (*(pCVar9->m_pFriends->super_IInterface)._vptr_IInterface[5])
                                  (pCVar9->m_pFriends,(pCVar12->m_Addr).ip + lVar14 + -4,
                                   (pCVar12->m_Info).m_NetAddr.ip + lVar14 + 0xd);
                pCVar12 = this->m_pServerBrowserFilter->m_ppServerlist[uVar13];
                *(int *)((pCVar12->m_Info).m_aGameType + lVar14 + 8) = iVar6;
                iVar5 = (pCVar12->m_Info).m_FriendState;
                if (iVar6 < iVar5) {
                  iVar6 = iVar5;
                }
                (pCVar12->m_Info).m_FriendState = iVar6;
                lVar15 = lVar15 + 1;
                pCVar9 = this->m_pServerBrowserFilter;
                pCVar12 = pCVar9->m_ppServerlist[uVar13];
                lVar14 = lVar14 + 0x84;
              } while (lVar15 < (pCVar12->m_Info).m_NumClients);
            }
            if ((((this->m_FilterInfo).m_SortHash & 0x100) == 0) ||
               ((pCVar12->m_Info).m_FriendState != 0)) {
              iVar5 = this->m_NumSortedServers;
              this->m_NumSortedServers = iVar5 + 1;
              this->m_pSortedServerlist[iVar5] = (int)uVar13;
              this->m_NumSortedPlayers = this->m_NumSortedPlayers + iVar11;
            }
          }
          else {
            pCVar12 = this->m_pServerBrowserFilter->m_ppServerlist[uVar13];
            lVar14 = (long)(pCVar12->m_Info).m_NumClients;
            if (0 < lVar14) {
              lVar15 = 0;
              do {
                if (*(int *)((pCVar12->m_Info).m_aClients[0].m_aClan + lVar15 + 0x33) ==
                    (this->m_FilterInfo).m_Country) goto LAB_0012daa9;
                lVar15 = lVar15 + 0x84;
              } while (lVar14 * 0x84 != lVar15);
            }
          }
        }
      }
LAB_0012d8ba:
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar2);
  }
  return;
}

Assistant:

void CServerBrowserFilter::CServerFilter::Filter()
{
	int NumServers = m_pServerBrowserFilter->m_NumServers;
	m_NumSortedServers = 0;
	m_NumSortedPlayers = 0;

	// allocate the sorted list
	if(m_SortedServersCapacity < NumServers)
	{
		if(m_pSortedServerlist)
			mem_free(m_pSortedServerlist);
		m_SortedServersCapacity = maximum(1000, NumServers+NumServers/2);
		m_pSortedServerlist = (int *)mem_alloc(m_SortedServersCapacity*sizeof(int));
	}

	// filter the servers
	for(int i = 0; i < NumServers; i++)
	{
		int Filtered = 0;

		int RelevantClientCount = (m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS) ? m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumPlayers : m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients;
		if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_BOTS)
		{
			RelevantClientCount -= m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumBotPlayers;
			if(!(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS))
				RelevantClientCount -= m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumBotSpectators;
		}

		if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_EMPTY && RelevantClientCount == 0)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FULL && ((m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS && m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumPlayers == m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_MaxPlayers) ||
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients == m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_MaxClients))
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PW && m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PASSWORD)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FAVORITE && !m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Favorite)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE && !(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PURE))
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE_MAP &&  !(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PUREMAP))
			Filtered = 1;
		else if(m_FilterInfo.m_Ping < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Latency)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COMPAT_VERSION && str_comp_num(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aVersion, m_pServerBrowserFilter->m_aNetVersion, 3) != 0)
			Filtered = 1;
		else if(m_FilterInfo.m_aAddress[0] && !str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aAddress, m_FilterInfo.m_aAddress))
			Filtered = 1;
		else if(m_FilterInfo.IsLevelFiltered(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_ServerLevel))
			Filtered = 1;
		else
		{
			if(m_FilterInfo.m_aGametype[0][0])
			{
				bool Excluded = false, DoInclude = false, Included = false;
				for(int Index = 0; Index < CServerFilterInfo::MAX_GAMETYPES; ++Index)
				{
					if(!m_FilterInfo.m_aGametype[Index][0])
						break;
					if(m_FilterInfo.m_aGametypeExclusive[Index])
					{
						if(!str_comp_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, m_FilterInfo.m_aGametype[Index]))
						{
							Excluded = true;
							break;
						}
					}
					else
					{
						DoInclude = true;
						if(!str_comp_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, m_FilterInfo.m_aGametype[Index]))
						{
							Included = true;
							break;
						}
					}
				}
				Filtered = Excluded || (DoInclude && !Included);
			}

			if(!Filtered && m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COUNTRY)
			{
				Filtered = 1;
				// match against player country
				for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
				{
					if(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_Country == m_FilterInfo.m_Country)
					{
						Filtered = 0;
						break;
					}
				}
			}

			if(!Filtered && Config()->m_BrFilterString[0] != 0)
			{
				int MatchFound = 0;

				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit = 0;

				// match against server name
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aName, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_SERVERNAME;
				}

				// match against players
				for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
				{
					if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aName, Config()->m_BrFilterString) ||
						str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aClan, Config()->m_BrFilterString))
					{
						MatchFound = 1;
						m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_PLAYER;
						break;
					}
				}

				// match against map
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aMap, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_MAPNAME;
				}

				// match against game type
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_GAMETYPE;
				}

				if(!MatchFound)
					Filtered = 1;
			}
		}

		if(Filtered == 0)
		{
			// check for friend
			m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState = CContactInfo::CONTACT_NO;
			for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
			{
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_FriendState = m_pServerBrowserFilter->m_pFriends->GetFriendState(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aName,
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aClan);
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState = maximum(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState, m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_FriendState);
			}

			if(!(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FRIENDS) || m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState != CContactInfo::CONTACT_NO)
			{
				m_pSortedServerlist[m_NumSortedServers++] = i;
				m_NumSortedPlayers += RelevantClientCount;
			}
		}
	}
}